

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O3

_Bool duckdb_je_tcache_bins_ncached_max_write(tsd_t *tsd,char *settings,size_t len)

{
  arena_t *arena;
  _Bool _Var1;
  long lVar2;
  cache_bin_info_t *info;
  cache_bin_info_t duckdb_je_tcache_bin_info [73];
  cache_bin_info_t acStack_c8 [76];
  
  info = acStack_c8;
  lVar2 = 0x1bf;
  do {
    duckdb_je_cache_bin_info_init
              (info,*(cache_bin_sz_t *)
                     (&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled +
                     lVar2 * 2));
    lVar2 = lVar2 + 0xc;
    info = info + 1;
  } while (lVar2 != 0x52b);
  _Var1 = tcache_bin_info_settings_parse(settings,len,acStack_c8,(_Bool *)0x0);
  if (!_Var1) {
    arena = ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).tcache_slow)->arena
    ;
    if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true) {
      tcache_destroy(tsd,&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,true);
      switchD_012e5a64::default
                ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins,0,0x6d8);
    }
    duckdb_je_tsd_tcache_data_init(tsd,arena,acStack_c8);
  }
  return _Var1;
}

Assistant:

bool
tcache_bins_ncached_max_write(tsd_t *tsd, char *settings, size_t len) {
	assert(tcache_available(tsd));
	assert(len != 0);
	tcache_t *tcache = tsd_tcachep_get(tsd);
	assert(tcache != NULL);
	cache_bin_info_t tcache_bin_info[TCACHE_NBINS_MAX];
	tcache_bin_settings_backup(tcache, tcache_bin_info);

	if(tcache_bin_info_settings_parse(settings, len, tcache_bin_info,
	    NULL)) {
		return true;
	}

	arena_t *assigned_arena = tcache->tcache_slow->arena;
	tcache_cleanup(tsd);
	tsd_tcache_data_init(tsd, assigned_arena,
	    tcache_bin_info);

	return false;
}